

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

Literals * __thiscall
wasm::ShellExternalInterface::callImport
          (Literals *__return_storage_ptr__,ShellExternalInterface *this,Function *import,
          Literals *arguments)

{
  Name *pNVar1;
  Literal LVar2;
  IString str;
  bool bVar3;
  value_type *pvVar4;
  ostream *poVar5;
  undefined8 uVar6;
  Fatal *pFVar7;
  undefined8 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  Type in_stack_fffffffffffffd68;
  Fatal local_248;
  size_t local_c0;
  char *local_b8;
  ModuleRunnerBase<wasm::ModuleRunner> *local_b0;
  ModuleRunner *inst;
  Literal local_90;
  undefined1 local_78 [8];
  value_type argument;
  ConstIterator __end3;
  ConstIterator __begin3;
  Literals *__range3;
  Literals *arguments_local;
  Function *import_local;
  ShellExternalInterface *this_local;
  
  bVar3 = IString::operator==(&(import->super_Importable).module.super_IString,(IString *)&SPECTEST)
  ;
  if ((bVar3) &&
     (str.str._M_str = _parseScript, str.str._M_len = PRINT,
     bVar3 = IString::startsWith(&(import->super_Importable).base.super_IString,str), bVar3)) {
    join_0x00000010_0x00000000_ =
         (IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
          )SmallVector<wasm::Literal,_1UL>::begin(&arguments->super_SmallVector<wasm::Literal,_1UL>)
    ;
    join_0x00000010_0x00000000_ =
         (IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
          )SmallVector<wasm::Literal,_1UL>::end(&arguments->super_SmallVector<wasm::Literal,_1UL>);
    while (bVar3 = SmallVector<wasm::Literal,_1UL>::
                   IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                   ::operator!=((IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                                 *)&__end3.
                                    super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                                    .index,(ConstIterator *)&argument.type), bVar3) {
      pvVar4 = SmallVector<wasm::Literal,_1UL>::ConstIterator::operator*
                         ((ConstIterator *)
                          &__end3.
                           super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                           .index);
      ::wasm::Literal::Literal((Literal *)local_78,pvVar4);
      ::wasm::Literal::Literal(&local_90,(Literal *)local_78);
      LVar2.field_0.func.super_IString.str._M_str = (char *)in_stack_fffffffffffffd60;
      LVar2.field_0.i64 = in_stack_fffffffffffffd58;
      LVar2.type.id = in_stack_fffffffffffffd68.id;
      poVar5 = (ostream *)::wasm::operator<<((ostream *)&std::cout,LVar2);
      poVar5 = std::operator<<(poVar5," : ");
      inst = (ModuleRunner *)argument.field_0.func.super_IString.str._M_str;
      poVar5 = (ostream *)
               ::wasm::operator<<(poVar5,(Type)argument.field_0.gcData.
                                               super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi);
      std::operator<<(poVar5,'\n');
      ::wasm::Literal::~Literal(&local_90);
      ::wasm::Literal::~Literal((Literal *)local_78);
      SmallVector<wasm::Literal,_1UL>::
      IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
      ::operator++((IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                    *)&__end3.
                       super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                       .index);
    }
    memset(__return_storage_ptr__,0,0x38);
    Literals::Literals(__return_storage_ptr__);
  }
  else {
    bVar3 = IString::operator==(&(import->super_Importable).module.super_IString,(IString *)&ENV);
    if ((bVar3) &&
       (bVar3 = IString::operator==(&(import->super_Importable).base.super_IString,(IString *)&EXIT)
       , bVar3)) {
      std::operator<<((ostream *)&std::cout,"exit()\n");
      uVar6 = __cxa_allocate_exception(1);
      __cxa_throw(uVar6,&ExitException::typeinfo,0);
    }
    local_b0 = &getImportInstance(this,&import->super_Importable)->
                super_ModuleRunnerBase<wasm::ModuleRunner>;
    if (local_b0 == (ModuleRunnerBase<wasm::ModuleRunner> *)0x0) {
      Fatal::Fatal(&local_248);
      pFVar7 = Fatal::operator<<(&local_248,(char (*) [29])"callImport: unknown import: ");
      pFVar7 = Fatal::operator<<(pFVar7,(basic_string_view<char,_std::char_traits<char>_> *)
                                        &(import->super_Importable).module);
      pFVar7 = Fatal::operator<<(pFVar7,(char (*) [2])0x1eb25b);
      Fatal::operator<<(pFVar7,(basic_string_view<char,_std::char_traits<char>_> *)import);
      Fatal::~Fatal(&local_248);
    }
    pNVar1 = &(import->super_Importable).base;
    local_c0 = (pNVar1->super_IString).str._M_len;
    local_b8 = (import->super_Importable).base.super_IString.str._M_str;
    ModuleRunnerBase<wasm::ModuleRunner>::callExport
              (__return_storage_ptr__,local_b0,(Name)(pNVar1->super_IString).str,arguments);
  }
  return __return_storage_ptr__;
}

Assistant:

Literals callImport(Function* import, const Literals& arguments) override {
    if (import->module == SPECTEST && import->base.startsWith(PRINT)) {
      for (auto argument : arguments) {
        std::cout << argument << " : " << argument.type << '\n';
      }
      return {};
    } else if (import->module == ENV && import->base == EXIT) {
      // XXX hack for torture tests
      std::cout << "exit()\n";
      throw ExitException();
    } else if (auto* inst = getImportInstance(import)) {
      return inst->callExport(import->base, arguments);
    }
    Fatal() << "callImport: unknown import: " << import->module.str << "."
            << import->name.str;
  }